

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_enc_Utf8Dfa.h
# Opt level: O3

void __thiscall
axl::enc::Utf8Dfa::
emitPendingCus<axl::enc::Convert<axl::enc::Utf16,axl::enc::Utf8,axl::sl::Nop<wchar_t,wchar_t>,axl::enc::Utf8Decoder>::CountingEmitter>
          (Utf8Dfa *this,CountingEmitter *emitter,utf8_t *p)

{
  uint_t uVar1;
  uint uVar2;
  uint uVar3;
  long lVar4;
  size_t sVar5;
  uint uVar6;
  
  uVar1 = (this->super_UtfDfa<axl::enc::Utf8Dfa,_axl::enc::Utf8CcMap>).m_state;
  switch(uVar1 << 0x1d | uVar1 - 0x10 >> 3) {
  case 0:
  case 1:
    uVar2 = (this->super_UtfDfa<axl::enc::Utf8Dfa,_axl::enc::Utf8CcMap>).m_cp | 0xc0;
    uVar6 = emitter->m_replacement;
    do {
      if (0xffff < uVar2) goto LAB_00125f2b;
      uVar3 = uVar2 & 0xf800;
      uVar2 = uVar6;
      uVar6 = 0xfffd;
    } while (uVar3 == 0xd800);
    break;
  case 2:
  case 3:
    uVar2 = (this->super_UtfDfa<axl::enc::Utf8Dfa,_axl::enc::Utf8CcMap>).m_cp | 0xe0;
    uVar6 = emitter->m_replacement;
    do {
      if (0xffff < uVar2) goto LAB_00125f2b;
      uVar3 = uVar2 & 0xf800;
      uVar2 = uVar6;
      uVar6 = 0xfffd;
    } while (uVar3 == 0xd800);
    break;
  case 4:
    uVar2 = (this->super_UtfDfa<axl::enc::Utf8Dfa,_axl::enc::Utf8CcMap>).m_cp >> 6 | 0xe0;
    uVar6 = emitter->m_replacement;
    do {
      if (0xffff < uVar2) goto LAB_00125f91;
      uVar3 = uVar2 & 0xf800;
      uVar2 = uVar6;
      uVar6 = 0xfffd;
    } while (uVar3 == 0xd800);
    goto LAB_00125f8a;
  default:
    goto switchD_00125eaf_caseD_5;
  case 6:
  case 7:
    uVar2 = (this->super_UtfDfa<axl::enc::Utf8Dfa,_axl::enc::Utf8CcMap>).m_cp | 0xf0;
    uVar6 = emitter->m_replacement;
    do {
      if (0xffff < uVar2) goto LAB_00125f2b;
      uVar3 = uVar2 & 0xf800;
      uVar2 = uVar6;
      uVar6 = 0xfffd;
    } while (uVar3 == 0xd800);
    break;
  case 8:
    uVar2 = (this->super_UtfDfa<axl::enc::Utf8Dfa,_axl::enc::Utf8CcMap>).m_cp >> 6 | 0xf0;
    uVar6 = emitter->m_replacement;
    do {
      if (0xffff < uVar2) goto LAB_00125f91;
      uVar3 = uVar2 & 0xf800;
      uVar2 = uVar6;
      uVar6 = 0xfffd;
    } while (uVar3 == 0xd800);
LAB_00125f8a:
    lVar4 = 1;
LAB_00125f96:
    sVar5 = lVar4 + emitter->m_length + 1;
    goto LAB_00125fdf;
  case 10:
    uVar2 = (this->super_UtfDfa<axl::enc::Utf8Dfa,_axl::enc::Utf8CcMap>).m_cp >> 0xc | 0xf0;
    uVar6 = emitter->m_replacement;
    do {
      if (0xffff < uVar2) {
        lVar4 = 2;
        goto LAB_00125fd5;
      }
      uVar3 = uVar2 & 0xf800;
      uVar2 = uVar6;
      uVar6 = 0xfffd;
    } while (uVar3 == 0xd800);
    lVar4 = 1;
LAB_00125fd5:
    sVar5 = lVar4 + emitter->m_length + 2;
    goto LAB_00125fdf;
  }
  lVar4 = 1;
LAB_00125f30:
  sVar5 = lVar4 + emitter->m_length;
LAB_00125fdf:
  emitter->m_length = sVar5;
switchD_00125eaf_caseD_5:
  return;
LAB_00125f91:
  lVar4 = 2;
  goto LAB_00125f96;
LAB_00125f2b:
  lVar4 = 2;
  goto LAB_00125f30;
}

Assistant:

void
	emitPendingCus(
		Emitter& emitter,
		const utf8_t* p
	) {
		switch (m_state) {
		case State_1_2:
		case State_1_2_Error:
			emitter.emitCu(p, 0xc0 | m_cp);
			break;

		case State_1_3:
		case State_1_3_Error:
			emitter.emitCu(p, 0xe0 | m_cp);
			break;

		case State_2_3:
			emitter.emitCu(p - 1, 0xe0 | (m_cp >> 6));
			emitter.emitCu(p, 0x80 | (m_cp & 0x3f));
			break;

		case State_1_4:
		case State_1_4_Error:
			emitter.emitCu(p, 0xf0 | m_cp);
			break;

		case State_2_4:
			emitter.emitCu(p - 1, 0xf0 | (m_cp >> 6));
			emitter.emitCu(p, 0x80 | (m_cp & 0x3f));
			break;

		case State_3_4:
			emitter.emitCu(p - 2, 0xf0 | (m_cp >> 12));
			emitter.emitCu(p - 1, 0x80 | ((m_cp >> 6) & 0x3f));
			emitter.emitCu(p, 0x80 | (m_cp & 0x3f));
			break;
		}
	}